

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  int iVar1;
  CallS c;
  StkId local_20;
  int local_18;
  
  local_20 = L->top + ~nargs;
  local_18 = nresults;
  iVar1 = luaD_pcall(L,f_call,&local_20,(long)local_20 - (long)L->stack,0);
  if (nresults == -1) {
    if (L->ci->top <= L->top) {
      L->ci->top = L->top;
    }
  }
  return iVar1;
}

Assistant:

static int lua_pcall(lua_State*L,int nargs,int nresults,int errfunc){
struct CallS c;
int status;
ptrdiff_t func;
api_checknelems(L,nargs+1);
checkresults(L,nargs,nresults);
if(errfunc==0)
func=0;
else{
StkId o=index2adr(L,errfunc);
api_checkvalidindex(L,o);
func=savestack(L,o);
}
c.func=L->top-(nargs+1);
c.nresults=nresults;
status=luaD_pcall(L,f_call,&c,savestack(L,c.func),func);
adjustresults(L,nresults);
return status;
}